

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::SMDImporter::ParseSignedInt(SMDImporter *this,char *szCurrent,char **szCurrentOut,int *out)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  byte bVar6;
  
  do {
    bVar1 = *szCurrent;
    uVar2 = (ulong)bVar1;
    if (0x20 < uVar2) {
LAB_00587350:
      pbVar4 = (byte *)szCurrent + ((bVar1 - 0x2b & 0xfd) == 0);
      bVar6 = *pbVar4;
      iVar5 = 0;
      if (0xf5 < (byte)(bVar6 - 0x3a)) {
        iVar5 = 0;
        do {
          iVar5 = (uint)(byte)(bVar6 - 0x30) + iVar5 * 10;
          bVar6 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        } while (0xf5 < (byte)(bVar6 - 0x3a));
      }
      if (szCurrentOut != (char **)0x0) {
        *szCurrentOut = (char *)pbVar4;
      }
      iVar3 = -iVar5;
      if (bVar1 != 0x2d) {
        iVar3 = iVar5;
      }
      *out = iVar3;
      return true;
    }
    if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
        return false;
      }
      goto LAB_00587350;
    }
    szCurrent = (char *)((byte *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseSignedInt(const char* szCurrent, const char** szCurrentOut, int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtol10(szCurrent,szCurrentOut);
    return true;
}